

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::SLUFactor<double>::solve3right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *y2,SVectorBase<double> *b,SSVectorBase<double> *rhs,
          SSVectorBase<double> *rhs2)

{
  int rn3;
  int iVar1;
  int *ridx;
  int *ridx2;
  int *ridx3;
  int *piVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *rhs3;
  int *forestIdx;
  double *forest;
  Real eps;
  int iVar8;
  int f;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar8 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  ridx2 = (rhs->super_IdxSet).idx;
  rn3 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx3 = (rhs2->super_IdxSet).idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->super_CLUFactor<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  eps = Tolerances::epsilon(local_40._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  SSVectorBase<double>::clear(x);
  VectorBase<double>::clear(y);
  VectorBase<double>::clear(y2);
  this->usetup = true;
  SSVectorBase<double>::operator=(&this->ssvec,b);
  if ((this->super_CLUFactor<double>).l.updateType == 0) {
    iVar1 = (this->ssvec).super_IdxSet.num;
    piVar2 = (x->super_IdxSet).idx;
    pdVar3 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar4 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar6 = (rhs->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    iVar8 = CLUFactor<double>::vSolveRight4update3
                      (&this->super_CLUFactor<double>,eps,pdVar3,piVar2,pdVar4,ridx,iVar1,pdVar5,eps
                       ,pdVar6,ridx2,iVar8,pdVar7,eps,
                       (rhs2->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,ridx3,rn3,(double *)0x0,(int *)0x0,
                       (int *)0x0);
    (x->super_IdxSet).num = iVar8;
    x->setupStatus = false;
    SSVectorBase<double>::setup_and_assign<double>(&this->eta,x);
  }
  else {
    SSVectorBase<double>::clear(&this->forest);
    iVar1 = (this->ssvec).super_IdxSet.num;
    piVar2 = (x->super_IdxSet).idx;
    pdVar3 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar4 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar6 = (rhs->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    rhs3 = (rhs2->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
    forestIdx = (this->forest).super_IdxSet.idx;
    forest = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    iVar8 = CLUFactor<double>::vSolveRight4update3
                      (&this->super_CLUFactor<double>,eps,pdVar3,piVar2,pdVar4,ridx,iVar1,pdVar5,eps
                       ,pdVar6,ridx2,iVar8,pdVar7,eps,rhs3,ridx3,rn3,forest,&f,forestIdx);
    (x->super_IdxSet).num = iVar8;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}